

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetPSTATAccessories(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*local_28) [2];
  char *dp;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 0;
    }
    local_28 = pol->PstatPassiveAccessories + (port + -0x41);
  }
  else {
    local_28 = pol->PstatAccessories + (port + -0x31);
  }
  if ((*local_28)[0] == '\0') {
    pol_local._4_4_ = 0;
  }
  else {
    uVar1 = ndiHexToUnsignedLong(*local_28,2);
    pol_local._4_4_ = (int)uVar1;
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetPSTATAccessories(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatAccessories[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveAccessories[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}